

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::formatNode(TaggerImpl *this,Node *node)

{
  int iVar1;
  Lattice *pLVar2;
  undefined4 extraout_var;
  
  pLVar2 = mutable_lattice(this);
  iVar1 = (*pLVar2->_vptr_Lattice[0x19])(pLVar2,node);
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    pLVar2 = mutable_lattice(this);
    (*pLVar2->_vptr_Lattice[0x24])(pLVar2);
    std::__cxx11::string::assign((char *)&this->what_);
  }
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const char* TaggerImpl::formatNode(const Node* node) {
  const char *result = mutable_lattice()->toString(node);
  if (!result) {
    set_what(mutable_lattice()->what());
    return 0;
  }
  return result;
}